

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateInitializers
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  ImmutableFieldLiteGenerator *pIVar2;
  long lVar3;
  long lVar4;
  
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar1 + 0x2c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      if (*(long *)(*(long *)(pDVar1 + 0x30) + 0x60 + lVar3) == 0) {
        pIVar2 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
                 get(&this->field_generators_,(FieldDescriptor *)(*(long *)(pDVar1 + 0x30) + lVar3))
        ;
        (*pIVar2->_vptr_ImmutableFieldLiteGenerator[7])(pIVar2,printer);
      }
      lVar4 = lVar4 + 1;
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(pDVar1 + 0x2c));
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateInitializers(io::Printer* printer) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateInitializationCode(printer);
    }
  }
}